

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_flat_map.hpp
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
 __thiscall
chaiscript::utility::
QuickFlatMap<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::str_equal>
::insert_or_assign<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
          (QuickFlatMap<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::str_equal>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *m)

{
  vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>
  _Var3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_bool>
  pVar5;
  
  _Var3 = find<std::__cxx11::string>(this,key);
  if (_Var3._M_current ==
      *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
        **)(this + 0x10)) {
    this_00 = (vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
               *)(this + 8);
    if (*(long *)(this + 0x18) == *(long *)(this + 0x10)) {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                 *)this_00,
                (*(long *)(this + 0x10) - *(long *)this_00 >> 4) * -0x5555555555555555 + 2);
    }
    _Var3._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
          *)std::
            vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>
            ::
            _M_emplace_aux<std::__cxx11::string_const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
                      (this_00,*(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>
                                 **)(this + 0x10),key,m);
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    peVar1 = (m->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    p_Var2 = (m->
             super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
             )._M_refcount._M_pi;
    (m->super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr = (element_type *)0x0;
    (m->super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = ((_Var3._M_current)->second).
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    ((_Var3._M_current)->second).
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar1;
    ((_Var3._M_current)->second).
    super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
    uVar4 = 0;
  }
  pVar5._8_8_ = uVar4;
  pVar5.first._M_current = _Var3._M_current;
  return pVar5;
}

Assistant:

auto insert_or_assign(const Key &key, M &&m) {
      if (auto itr = find(key); itr != data.end()) {
        itr->second = std::forward<M>(m);
        return std::pair{itr, false};
      } else {
        grow();
        return std::pair{data.emplace(data.end(), key, std::forward<M>(m)), true};
      }
    }